

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
CoreML::LinearModel::getOffsets
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,LinearModel *this)

{
  Model *this_00;
  ulong uVar1;
  long lVar2;
  iterator __position;
  Pipeline *pPVar3;
  Arena *arena;
  long lVar4;
  long lVar5;
  double n;
  double local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] == 300) {
    pPVar3 = (this_00->Type_).pipeline_;
  }
  else {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 300;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pPVar3 = (Pipeline *)
             google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GLMRegressor>(arena)
    ;
    (this_00->Type_).glmregressor_ = (GLMRegressor *)pPVar3;
  }
  lVar5 = (long)*(int *)&(pPVar3->names_).super_RepeatedPtrFieldBase.arena_;
  if (lVar5 != 0) {
    lVar2 = *(long *)&(pPVar3->names_).super_RepeatedPtrFieldBase.current_size_;
    lVar4 = 0;
    do {
      local_30 = *(double *)(lVar2 + lVar4);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   &local_30);
      }
      else {
        *__position._M_current = local_30;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar4 = lVar4 + 8;
    } while (lVar5 * 8 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> LinearModel::getOffsets() {
        std::vector<double> result;
        auto lr = m_spec->mutable_glmregressor();
        for(double n : lr->offset()) {
            result.push_back(n);
        }
        return result;
    }